

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

App * __thiscall CLI::App::needs(App *this,Option *opt)

{
  OptionNotFound *this_00;
  Option *local_48;
  string local_40;
  
  local_48 = opt;
  if (opt != (Option *)0x0) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*const&>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&this->need_options_,&local_48);
    return this;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nullptr passed","");
  OptionNotFound::OptionNotFound(this_00,&local_40);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *needs(Option *opt) {
        if(opt == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        need_options_.insert(opt);
        return this;
    }